

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O0

int main(void)

{
  initializer_list<A_*> __l;
  initializer_list<float> il;
  initializer_list<float> il_00;
  initializer_list<float> il_01;
  bool bVar1;
  ulong uVar2;
  out_of_range *this;
  invalid_argument *this_00;
  ostream *poVar3;
  B *pBVar4;
  C *pCVar5;
  reference this_01;
  reference ppAVar6;
  reference pvVar7;
  pointer pAVar8;
  unique_ptr *this_02;
  reference __x;
  reference pbVar9;
  string local_430 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_4;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_3d8;
  undefined1 local_3b8 [8];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  f_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  *__range1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sv;
  string local_360 [8];
  string john;
  value_type local_340;
  value_type local_320;
  value_type local_300;
  undefined1 local_2e0 [8];
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  fv;
  string local_2c0 [32];
  undefined1 local_2a0 [8];
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> baz;
  anon_class_8_1_a7fabe29 aStack_278;
  anon_class_4_1_6b1f3fee bar;
  anon_class_8_1_a7fabe29 foo;
  int secret;
  string greet;
  unique_ptr<A,_std::default_delete<A>_> *ap_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  *__range1_2;
  unique_ptr<A,_std::default_delete<A>_> local_218;
  A *local_210;
  A *ap_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<A_*,_std::allocator<A_*>_> *__range1_1;
  unique_ptr<A,_std::default_delete<A>_> *ap;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  *__range1;
  B *local_1c8;
  B *local_1c0;
  C *local_1b8;
  C *local_1b0;
  B **local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  vector<A_*,_std::allocator<A_*>_> vpa;
  unique_ptr<C,_std::default_delete<C>_> local_178;
  unique_ptr<A,_std::default_delete<A>_> local_170;
  undefined4 local_164;
  unique_ptr<C,_std::default_delete<C>_> local_160;
  unique_ptr<A,_std::default_delete<A>_> local_158;
  undefined4 local_14c;
  unique_ptr<B,_std::default_delete<B>_> local_148;
  unique_ptr<A,_std::default_delete<A>_> local_140;
  undefined4 local_134;
  unique_ptr<B,_std::default_delete<B>_> local_130;
  unique_ptr<A,_std::default_delete<A>_> local_128;
  undefined1 local_120 [8];
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  vua;
  exception *e_2;
  Vec<float,_4UL> m;
  Vec<float,_3UL> local_e4;
  float local_d8 [4];
  iterator local_c8;
  undefined8 local_c0;
  undefined1 local_b4 [8];
  Vec<float,_4UL> h;
  undefined1 local_88 [8];
  Vec<float,_3UL> g;
  undefined1 local_5c [8];
  Vec<float,_3UL> f;
  out_of_range *e;
  invalid_argument *e_1;
  string local_30 [8];
  string s;
  
  std::__cxx11::string::string(local_30);
  std::operator>>((istream *)&std::cin,local_30);
  uVar2 = std::__cxx11::string::length();
  if (10 < uVar2) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 5) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid argument");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar3,'\n');
  g.data[1] = 0.1;
  g.data[2] = 0.2;
  il_01._M_len = 3;
  il_01._M_array = g.data + 1;
  Vec<float,_3UL>::Vec((Vec<float,_3UL> *)local_5c,il_01);
  h.data[2] = 0.1;
  h.data[3] = 0.2;
  il_00._M_len = 3;
  il_00._M_array = h.data + 2;
  Vec<float,_3UL>::Vec((Vec<float,_3UL> *)local_88,il_00);
  local_d8[0] = 0.1;
  local_d8[1] = 0.2;
  local_d8[2] = 0.3;
  local_d8[3] = 0.5;
  local_c8 = local_d8;
  local_c0 = 4;
  il._M_len = 4;
  il._M_array = local_c8;
  Vec<float,_4UL>::Vec((Vec<float,_4UL> *)local_b4,il);
  Vec<float,3ul>::operator*((Vec<float,3ul> *)(m.data + 2),(Vec<float,_3UL> *)local_5c);
  Vec<float,3ul>::operator+((Vec<float,3ul> *)&local_e4,(Vec<float,_3UL> *)(m.data + 2));
  poVar3 = operator<<((ostream *)&std::cout,&local_e4);
  std::operator<<(poVar3,'\n');
  Vec<float,3ul>::operator+((Vec<float,3ul> *)&e_2,(Vec<float,_4UL> *)local_88);
  poVar3 = operator<<((ostream *)&std::cout,(Vec<float,_4UL> *)&e_2);
  std::operator<<(poVar3,'\n');
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::vector((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
            *)local_120);
  local_134 = 3;
  std::make_unique<B,int>((int *)&local_130);
  std::unique_ptr<A,std::default_delete<A>>::unique_ptr<B,std::default_delete<B>,void>
            ((unique_ptr<A,std::default_delete<A>> *)&local_128,&local_130);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::push_back((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               *)local_120,(value_type *)&local_128);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_128);
  std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr(&local_130);
  local_14c = 4;
  std::make_unique<B,int>((int *)&local_148);
  std::unique_ptr<A,std::default_delete<A>>::unique_ptr<B,std::default_delete<B>,void>
            ((unique_ptr<A,std::default_delete<A>> *)&local_140,&local_148);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::push_back((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               *)local_120,(value_type *)&local_140);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_140);
  std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr(&local_148);
  local_164 = 5;
  std::make_unique<C,int>((int *)&local_160);
  std::unique_ptr<A,std::default_delete<A>>::unique_ptr<C,std::default_delete<C>,void>
            ((unique_ptr<A,std::default_delete<A>> *)&local_158,&local_160);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::push_back((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               *)local_120,(value_type *)&local_158);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_158);
  std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr(&local_160);
  vpa.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 6;
  std::make_unique<C,int>((int *)&local_178);
  std::unique_ptr<A,std::default_delete<A>>::unique_ptr<C,std::default_delete<C>,void>
            ((unique_ptr<A,std::default_delete<A>> *)&local_170,&local_178);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::push_back((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               *)local_120,(value_type *)&local_170);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_170);
  std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr(&local_178);
  pBVar4 = (B *)operator_new(0x10);
  B::B(pBVar4,1);
  local_1c8 = pBVar4;
  pBVar4 = (B *)operator_new(0x10);
  B::B(pBVar4,2);
  local_1c0 = pBVar4;
  pCVar5 = (C *)operator_new(0x10);
  C::C(pCVar5,7);
  local_1b8 = pCVar5;
  pCVar5 = (C *)operator_new(0x10);
  C::C(pCVar5,8);
  local_1a8 = &local_1c8;
  local_1a0 = 4;
  local_1b0 = pCVar5;
  std::allocator<A_*>::allocator((allocator<A_*> *)((long)&__range1 + 7));
  __l._M_len = local_1a0;
  __l._M_array = (iterator)local_1a8;
  std::vector<A_*,_std::allocator<A_*>_>::vector
            ((vector<A_*,_std::allocator<A_*>_> *)local_198,__l,
             (allocator<A_*> *)((long)&__range1 + 7));
  std::allocator<A_*>::~allocator((allocator<A_*> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ::begin((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                    *)local_120);
  ap = (unique_ptr<A,_std::default_delete<A>_> *)
       std::
       vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
       ::end((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
              *)local_120);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
                                *)&ap);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
              ::operator*(&__end1);
    pAVar8 = std::unique_ptr<A,_std::default_delete<A>_>::operator->(this_01);
    (**pAVar8->_vptr_A)();
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<A_*,_std::allocator<A_*>_>::begin
                       ((vector<A_*,_std::allocator<A_*>_> *)local_198);
  ap_1 = (A *)std::vector<A_*,_std::allocator<A_*>_>::end
                        ((vector<A_*,_std::allocator<A_*>_> *)local_198);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<A_**,_std::vector<A_*,_std::allocator<A_*>_>_> *)&ap_1);
    if (!bVar1) break;
    ppAVar6 = __gnu_cxx::__normal_iterator<A_**,_std::vector<A_*,_std::allocator<A_*>_>_>::operator*
                        (&__end1_1);
    local_210 = *ppAVar6;
    (**local_210->_vptr_A)();
    __gnu_cxx::__normal_iterator<A_**,_std::vector<A_*,_std::allocator<A_*>_>_>::operator++
              (&__end1_1);
  }
  pvVar7 = std::
           vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ::operator[]((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                         *)local_120,1);
  std::unique_ptr<A,_std::default_delete<A>_>::unique_ptr(&local_218,pvVar7);
  takes_ownership(&local_218);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_218);
  pvVar7 = std::
           vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ::operator[]((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                         *)local_120,2);
  pAVar8 = std::unique_ptr<A,_std::default_delete<A>_>::release(pvVar7);
  std::shared_ptr<A>::shared_ptr<A,void>((shared_ptr<A> *)&__range1_2,pAVar8);
  shared_ownership((shared_ptr<A> *)&__range1_2);
  std::shared_ptr<A>::~shared_ptr((shared_ptr<A> *)&__range1_2);
  __end1_2 = std::
             vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
             ::begin((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                      *)local_120);
  ap_2 = (unique_ptr<A,_std::default_delete<A>_> *)
         std::
         vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
         ::end((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                *)local_120);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
                        *)&ap_2);
    if (!bVar1) break;
    this_02 = (unique_ptr *)
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
              ::operator*(&__end1_2);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_02);
    if (bVar1) {
      pAVar8 = std::unique_ptr<A,_std::default_delete<A>_>::operator->
                         ((unique_ptr<A,_std::default_delete<A>_> *)this_02);
      (**pAVar8->_vptr_A)();
    }
    else {
      std::operator<<((ostream *)&std::cout,"The ownership has moved away!\n");
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<A,_std::default_delete<A>_>_*,_std::vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>_>
    ::operator++(&__end1_2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&secret,"Hello, ",(allocator *)((long)&foo.greet + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&foo.greet + 7));
  foo.greet._0_4_ = 0x2a;
  aStack_278.greet = (string *)&secret;
  baz._28_4_ = 0x2a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c0,"Bye, ",
             (allocator *)
             ((long)&fv.
                     super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Adder
            ((Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fv.
                     super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::vector((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
            *)local_2e0);
  std::function<std::__cxx11::string(std::__cxx11::string)>::function<main::__0&,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_300,
             &stack0xfffffffffffffd88);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::push_back((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
               *)local_2e0,&local_300);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_300);
  std::function<std::__cxx11::string(std::__cxx11::string)>::function<main::__1&,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_320,
             (anon_class_4_1_6b1f3fee *)&baz.field_0x1c);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::push_back((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
               *)local_2e0,&local_320);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_320);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<Adder<std::__cxx11::string>&,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_340,
             (Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::push_back((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
               *)local_2e0,&local_340);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_360,"John Doe",
             (allocator *)
             ((long)&sv.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sv.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_3);
  __end1_3 = std::
             vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
             ::begin((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
                      *)local_2e0);
  f_1._M_invoker =
       (_Invoker_type)
       std::
       vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
       ::end((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
              *)local_2e0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
                        *)&f_1._M_invoker);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
          ::operator*(&__end1_3);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)local_3b8,__x);
    std::__cxx11::string::string((string *)&__range1_4,local_360);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&local_3d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1_3,(value_type *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&__range1_4);
    std::operator<<((ostream *)&std::cout,"a\n");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)local_3b8);
    __gnu_cxx::
    __normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
    ::operator++(&__end1_3);
  }
  __end1_4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_3);
  local_410._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_4,&local_410);
    if (!bVar1) break;
    pbVar9 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_4);
    std::__cxx11::string::string(local_430,(string *)pbVar9);
    poVar3 = std::operator<<((ostream *)&std::cout,local_430);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string(local_430);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_3);
  std::__cxx11::string::~string(local_360);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  ::~vector((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
             *)local_2e0);
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Adder
            ((Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a0);
  std::__cxx11::string::~string((string *)&secret);
  std::vector<A_*,_std::allocator<A_*>_>::~vector((vector<A_*,_std::allocator<A_*>_> *)local_198);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::~vector((vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
             *)local_120);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
    /**
     * 1. try-block for exception handling
     */
    std::string s;
    std::cin >> s;

    try {
        if (s.length() > 10) {
            throw std::out_of_range("Out of range");
        } else if (s.length() < 5) {
            throw std::invalid_argument("invalid argument");
        } else {
            std::cout << s << '\n';
        }
    } catch (const std::out_of_range& e) {
        std::cout << e.what() << '\n';
    } catch (const std::invalid_argument& e) {
        std::cout << e.what() << '\n';
    }

    /**
     * 2. Constant template
     */
    Vec<float, 3> f{0.1, 0.2, 0.3};
    Vec<float, 3> g{0.1, 0.2, 0.3};
    Vec<float, 4> h{0.1, 0.2, 0.3, 0.5};

    std::cout << (f * g) + f << '\n';

    try {
        // Vector size mismatch
        auto m = g + h;
        
        // Never reached
        std::cout << m << '\n';
    } catch (const std::exception& e) {
        std::cout << e.what() << '\n';
    }

    // unique_ptr for strict ownership management
    std::vector<std::unique_ptr<A>> vua;
    vua.push_back(std::make_unique<B>(3));
    vua.push_back(std::make_unique<B>(4));
    vua.push_back(std::make_unique<C>(5));
    vua.push_back(std::make_unique<C>(6));

    std::vector<A*> vpa = {
        new B(1),
        new B(2),
        new C(7),
        new C(8)
    };

    for (auto&& ap : vua) {
        ap->foo();
    }

    for (auto ap : vpa) {
        ap->foo();
    }

    // The ownership is passed to the function. Note `std::move()` used here
    takes_ownership(std::move(vua[1]));
    // `unique_ptr` can also be shared over multiple functions.
    // Note that `.release()` is called to release a shared_ptr from the `unique_ptr`.
    shared_ownership(std::shared_ptr<A>(vua[2].release()));

    for (auto&& ap : vua) {
        if (!ap) {
            std::cout << "The ownership has moved away!\n";
        } else {
            ap->foo();
        }
    }
    
    /**
     * 4. Lambda
     */
    std::string greet = "Hello, ";
    int secret = 42;

    // Captures the _reference_  of `greet`
    auto foo = [&greet](std::string name){ return greet + name; };

    // Capatures the _value_ of `secret`
    auto bar = [secret](std::string name){
        std::ostringstream oss;

        oss << name << "got the secret (" << secret << ')';

        return oss.str();
    };

    auto baz = Adder<std::string>{"Bye, "};

    std::vector<std::function<std::string(std::string)>> fv;
    fv.push_back(foo);
    fv.push_back(bar);

    // A function class is also considered as a function type
    fv.push_back(baz);

    std::string john = "John Doe";
    std::vector<std::string> sv;
    for (auto f : fv) {
        sv.push_back(f(john));
        std::cout << "a\n";
    }

    for (auto s : sv) {
        std::cout << s << '\n';
    }
}